

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<std::vector<char,_std::allocator<char>_>_> *
wasm::WATParser::anon_unknown_11::datastring<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<std::vector<char,_std::allocator<char>_>_> *__return_storage_ptr__,
          ParseDeclsCtx *ctx)

{
  string_view str_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  undefined1 local_48 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> str;
  vector<char,_std::allocator<char>_> data;
  ParseDeclsCtx *ctx_local;
  
  ParseDeclsCtx::makeDataString
            ((vector<char,_std::allocator<char>_> *)
             &str.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged,ctx);
  while( true ) {
    ParseInput::takeString
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_48,&ctx->in
              );
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
    if (!bVar1) break;
    pbVar2 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_48
                       );
    str_00._M_len = pbVar2->_M_len;
    str_00._M_str = pbVar2->_M_str;
    ParseDeclsCtx::appendDataString
              (ctx,(vector<char,_std::allocator<char>_> *)
                   &str.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_engaged,str_00);
  }
  Result<std::vector<char,std::allocator<char>>>::Result<std::vector<char,std::allocator<char>>>
            ((Result<std::vector<char,std::allocator<char>>> *)__return_storage_ptr__,
             (vector<char,_std::allocator<char>_> *)
             &str.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &str.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataStringT> datastring(Ctx& ctx) {
  auto data = ctx.makeDataString();
  while (auto str = ctx.in.takeString()) {
    ctx.appendDataString(data, *str);
  }
  return data;
}